

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindLeastGreatest<duckdb::GreaterOp>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  ulong uVar1;
  LogicalTypeId LVar2;
  PhysicalType PVar3;
  size_type sVar4;
  undefined8 uVar5;
  pointer this;
  reference other;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  LogicalType *this_00;
  long in_RDX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType arg_type;
  idx_t i;
  LogicalType child_type;
  LogicalType *in_stack_00000488;
  LogicalType *in_stack_fffffffffffffe78;
  LogicalType *in_stack_fffffffffffffe80;
  LogicalType *in_stack_fffffffffffffe88;
  LogicalType *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffea0;
  allocator *paVar6;
  ClientContext *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  Expression *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  BinderException *in_stack_ffffffffffffff58;
  optional_idx in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [32];
  idx_t local_70;
  ulong local_40;
  LogicalType local_38;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe80);
  ExpressionBinder::GetExpressionReturnType(in_stack_fffffffffffffef8);
  for (local_40 = 1; uVar1 = local_40,
      sVar4 = ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::size(local_20), uVar1 < sVar4; local_40 = local_40 + 1) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe80);
    ExpressionBinder::GetExpressionReturnType(in_stack_fffffffffffffef8);
    in_stack_fffffffffffffec7 =
         LogicalType::TryGetMaxLogicalType
                   (in_stack_fffffffffffffea8,(LogicalType *)in_stack_fffffffffffffea0,
                    (LogicalType *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                    in_stack_fffffffffffffe90);
    if (!(bool)in_stack_fffffffffffffec7) {
      uVar5 = __cxa_allocate_exception(0x10);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      this = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe80);
      local_70 = (idx_t)BaseExpression::GetQueryLocation(&this->super_BaseExpression);
      paVar6 = &local_91;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_90,"Cannot combine types of %s and %s - an explicit cast is required",paVar6)
      ;
      LogicalType::ToString_abi_cxx11_(in_stack_00000488);
      LogicalType::ToString_abi_cxx11_(in_stack_00000488);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
    }
    LogicalType::~LogicalType((LogicalType *)0x2019dd5);
  }
  LVar2 = LogicalType::id(&local_38);
  if (LVar2 != UNKNOWN) {
    if (LVar2 == STRING_LITERAL) {
      LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffea0,STRING_LITERAL);
      LogicalType::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      LogicalType::~LogicalType((LogicalType *)0x2019ef8);
    }
    else if (LVar2 == INTEGER_LITERAL) {
      IntegerLiteral::GetType(in_stack_fffffffffffffe88);
      LogicalType::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      LogicalType::~LogicalType((LogicalType *)0x2019ec9);
    }
    PVar3 = LogicalType::InternalType(&local_38);
    this_00 = (LogicalType *)(ulong)(byte)(PVar3 + 0x38);
    switch(this_00) {
    case (LogicalType *)0x0:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
      break;
    default:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
      *(code **)(local_18 + 0xe0) = LeastGreatestSortKeyInit<duckdb::GreaterOp>;
      break;
    case (LogicalType *)0x4:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
      break;
    case (LogicalType *)0x39:
    case (LogicalType *)0x3b:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
      break;
    case (LogicalType *)0x3d:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
      break;
    case (LogicalType *)0x3f:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
      break;
    case (LogicalType *)0x41:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
      break;
    case (LogicalType *)0x44:
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_fffffffffffffea0,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)
                 CONCAT17(LVar2,in_stack_fffffffffffffe98));
    }
    other = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe80,
                       (size_type)in_stack_fffffffffffffe78);
    LogicalType::operator=(this_00,other);
    LogicalType::operator=(this_00,other);
    LogicalType::operator=(this_00,other);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<std::default_delete<duckdb::FunctionData>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               other,in_stack_fffffffffffffe78);
    LogicalType::~LogicalType((LogicalType *)0x201a0b6);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  uVar5 = __cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException
            ((ParameterNotResolvedException *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  __cxa_throw(uVar5,&ParameterNotResolvedException::typeinfo,
              ParameterNotResolvedException::~ParameterNotResolvedException);
}

Assistant:

unique_ptr<FunctionData> BindLeastGreatest(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	LogicalType child_type = ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			throw BinderException(arguments[i]->GetQueryLocation(),
			                      "Cannot combine types of %s and %s - an explicit cast is required",
			                      child_type.ToString(), arg_type.ToString());
		}
	}
	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::INTEGER_LITERAL:
		child_type = IntegerLiteral::GetType(child_type);
		break;
	case LogicalTypeId::STRING_LITERAL:
		child_type = LogicalType::VARCHAR;
		break;
	default:
		break;
	}
	using OP = typename LEAST_GREATER_OP::OP;
	switch (child_type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		bound_function.function = LeastGreatestFunction<int8_t, OP>;
		break;
	case PhysicalType::INT16:
		bound_function.function = LeastGreatestFunction<int16_t, OP>;
		break;
	case PhysicalType::INT32:
		bound_function.function = LeastGreatestFunction<int32_t, OP>;
		break;
	case PhysicalType::INT64:
		bound_function.function = LeastGreatestFunction<int64_t, OP>;
		break;
	case PhysicalType::INT128:
		bound_function.function = LeastGreatestFunction<hugeint_t, OP>;
		break;
	case PhysicalType::DOUBLE:
		bound_function.function = LeastGreatestFunction<double, OP>;
		break;
	case PhysicalType::VARCHAR:
		bound_function.function = LeastGreatestFunction<string_t, OP, StandardLeastGreatest<true>>;
		break;
#endif
	default:
		// fallback with sort keys
		bound_function.function = LeastGreatestFunction<string_t, OP, SortKeyLeastGreatest>;
		bound_function.init_local_state = LeastGreatestSortKeyInit<LEAST_GREATER_OP>;
		break;
	}
	bound_function.arguments[0] = child_type;
	bound_function.varargs = child_type;
	bound_function.return_type = child_type;
	return nullptr;
}